

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

WhereTerm * findTerm(WhereClause *pWC,int iCur,int iColumn,Bitmask notReady,u32 op,Index *pIdx)

{
  ulong in_RCX;
  WhereScan scan;
  WhereTerm *p;
  WhereTerm *pResult;
  Index *in_stack_ffffffffffffff38;
  u32 in_stack_ffffffffffffff44;
  int in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  WhereClause *in_stack_ffffffffffffff50;
  WhereScan *in_stack_ffffffffffffff58;
  WhereScan *in_stack_ffffffffffffff68;
  WhereTerm *local_40;
  WhereTerm *local_38;
  
  local_38 = (WhereTerm *)0x0;
  local_40 = whereScanInit(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                           in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48,
                           in_stack_ffffffffffffff44,in_stack_ffffffffffffff38);
  do {
    if (local_40 == (WhereTerm *)0x0) {
      return local_38;
    }
    if ((local_40->prereqRight & in_RCX) == 0) {
      if ((local_40->prereqRight == 0) && ((local_40->eOperator & 2) != 0)) {
        return local_40;
      }
      if (local_38 == (WhereTerm *)0x0) {
        local_38 = local_40;
      }
    }
    local_40 = whereScanNext(in_stack_ffffffffffffff68);
  } while( true );
}

Assistant:

static WhereTerm *findTerm(
  WhereClause *pWC,     /* The WHERE clause to be searched */
  int iCur,             /* Cursor number of LHS */
  int iColumn,          /* Column number of LHS */
  Bitmask notReady,     /* RHS must not overlap with this mask */
  u32 op,               /* Mask of WO_xx values describing operator */
  Index *pIdx           /* Must be compatible with this index, if not NULL */
){
  WhereTerm *pResult = 0;
  WhereTerm *p;
  WhereScan scan;

  p = whereScanInit(&scan, pWC, iCur, iColumn, op, pIdx);
  while( p ){
    if( (p->prereqRight & notReady)==0 ){
      if( p->prereqRight==0 && (p->eOperator&WO_EQ)!=0 ){
        return p;
      }
      if( pResult==0 ) pResult = p;
    }
    p = whereScanNext(&scan);
  }
  return pResult;
}